

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserProbModelXML.cpp
# Opt level: O0

void __thiscall ParserProbModelXML::InitializeLRFs(ParserProbModelXML *this)

{
  xmlXPathContextPtr pxVar1;
  ParserProbModelXML *this_00;
  undefined8 uVar2;
  ParserProbModelXML *in_RDI;
  pair<ParserProbModelXML::elm_type,_unsigned_int> element;
  string name;
  int i;
  xmlNodeSetPtr reward_nodeset;
  xmlXPathObjectPtr reward_nodes;
  xmlChar *xpath;
  elm_type *in_stack_ffffffffffffff68;
  FactoredDecPOMDPDiscrete *in_stack_ffffffffffffff70;
  xmlNodePtr in_stack_ffffffffffffff78;
  xmlChar *in_stack_ffffffffffffff80;
  pair<ParserProbModelXML::elm_type,_int> local_68;
  pair<ParserProbModelXML::elm_type,_unsigned_int> local_60;
  key_type *in_stack_ffffffffffffffa8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParserProbModelXML::elm_type,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParserProbModelXML::elm_type,_unsigned_int>_>_>_>
  *in_stack_ffffffffffffffb0;
  int local_34;
  xmlNodePtr in_stack_ffffffffffffffe0;
  
  this_00 = (ParserProbModelXML *)
            GetNodesMatchingExpression(in_RDI,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  if (this_00 == (ParserProbModelXML *)0x0) {
    uVar2 = __cxa_allocate_exception(0x28);
    EParse::EParse((EParse *)in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
    __cxa_throw(uVar2,&EParse::typeinfo,EParse::~EParse);
  }
  pxVar1 = this_00->_m_context;
  for (local_34 = 0; local_34 < *(int *)&pxVar1->doc; local_34 = local_34 + 1) {
    GetVariableName_abi_cxx11_(this_00,in_stack_ffffffffffffffe0);
    local_68 = std::make_pair<ParserProbModelXML::elm_type,int&>
                         (in_stack_ffffffffffffff68,(int *)0xa88639);
    std::pair<ParserProbModelXML::elm_type,_unsigned_int>::
    pair<ParserProbModelXML::elm_type,_int,_true>(&local_60,&local_68);
    in_stack_ffffffffffffff70 =
         (FactoredDecPOMDPDiscrete *)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParserProbModelXML::elm_type,_unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParserProbModelXML::elm_type,_unsigned_int>_>_>_>
         ::operator[](in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    std::pair<ParserProbModelXML::elm_type,_unsigned_int>::operator=
              ((pair<ParserProbModelXML::elm_type,_unsigned_int> *)in_stack_ffffffffffffff70,
               &local_60);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
  }
  FactoredDecPOMDPDiscrete::SetNrLRFs(in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68);
  xmlXPathFreeObject(this_00);
  return;
}

Assistant:

void ParserProbModelXML::InitializeLRFs()
{
    xmlChar *xpath = (xmlChar*) "/ProbModelXML/ProbNet/Variables/Variable[@role='utility']";
    xmlXPathObjectPtr reward_nodes = GetNodesMatchingExpression(xpath);

    if(reward_nodes == NULL){
        throw EParse("No reward variables found in the model.");
    }

    xmlNodeSetPtr reward_nodeset = reward_nodes->nodesetval;
    for(int i = 0; i < reward_nodeset->nodeNr; i++)
    {
        string name = GetVariableName(reward_nodeset->nodeTab[i]);
        pair<elm_type, Index> element = make_pair(REWARD, i);
        _m_parsedElements[name] = element;
    }

    _m_fDecPOMDP->SetNrLRFs(reward_nodeset->nodeNr);

    xmlXPathFreeObject (reward_nodes);
}